

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

StringPtr kj::stringifyStackTraceAddresses(ArrayPtr<void_*const> trace,ArrayPtr<char> scratch)

{
  long lVar1;
  undefined8 uVar2;
  ArrayPtr<const_char> AVar3;
  ArrayPtr<char> buffer;
  void ***local_50;
  char *local_48;
  undefined8 local_40;
  long local_38;
  undefined8 uStack_30;
  undefined8 *local_28;
  void **local_20;
  size_t local_18;
  
  local_18 = trace.size_;
  local_20 = trace.ptr;
  local_50 = &local_20;
  local_48 = " ";
  local_40 = 2;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = (undefined8 *)0x0;
  buffer.size_ = (size_t)&local_50;
  buffer.ptr = (char *)scratch.size_;
  AVar3 = (ArrayPtr<const_char>)
          strPreallocated<kj::_::Delimited<kj::ArrayPtr<void*const>&>>
                    ((kj *)scratch.ptr,buffer,
                     (Delimited<kj::ArrayPtr<void_*const>_&> *)scratch.size_);
  uVar2 = uStack_30;
  lVar1 = local_38;
  if (local_38 != 0) {
    local_38 = 0;
    uStack_30 = 0;
    (**(code **)*local_28)(local_28,lVar1,0x20,uVar2,uVar2,0);
  }
  return (StringPtr)AVar3;
}

Assistant:

StringPtr stringifyStackTraceAddresses(ArrayPtr<void* const> trace, ArrayPtr<char> scratch) {
  // Version which writes into a pre-allocated buffer. This is safe for signal handlers to the
  // extent that dladdr() is safe.
  //
  // TODO(cleanup): We should improve the KJ stringification framework so that there's a way to
  //   write this string directly into a larger message buffer with strPreallocated().

#if KJ_HAS_LIBDL
  char* ptr = scratch.begin();
  char* limit = scratch.end() - 1;

  for (auto addr: trace) {
    Dl_info info;
    // Shared libraries are mapped near the end of the address space while the executable is mapped
    // near the beginning. We want to print addresses in the executable as raw addresses, not
    // offsets, since that's what addr2line expects for executables. For shared libraries it
    // expects offsets. In any case, most frames are likely to be in the main executable so it
    // makes the output cleaner if we don't repeatedly write its name.
    if (reinterpret_cast<uintptr_t>(addr) >= 0x400000000000ull && dladdr(addr, &info)) {
      uintptr_t offset = reinterpret_cast<uintptr_t>(addr) -
                         reinterpret_cast<uintptr_t>(info.dli_fbase);
      ptr = _::fillLimited(ptr, limit, kj::StringPtr(info.dli_fname), "@0x"_kj, hex(offset));
    } else {
      ptr = _::fillLimited(ptr, limit, toCharSequence(addr));
    }

    ptr = _::fillLimited(ptr, limit, " "_kj);
  }
  *ptr = '\0';
  return StringPtr(scratch.begin(), ptr);
#else
  // TODO(someday): Support other platforms.
  return kj::strPreallocated(scratch, kj::delimited(trace, " "));
#endif
}